

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::updateEditorData
          (QAbstractItemViewPrivate *this,QModelIndex *tl,QModelIndex *br)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QAbstractItemView *pQVar4;
  QWidget *pQVar5;
  QEditorInfo *pQVar6;
  long *plVar7;
  QModelIndex *in_RDX;
  QModelIndex *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemDelegate *delegate;
  QWidget *editor;
  bool checkIndexes;
  QAbstractItemView *q;
  QModelIndex index;
  const_iterator it;
  QIndexEditorHash indexEditorHashCopy;
  QModelIndex parent;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3d;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  undefined7 in_stack_ffffffffffffff48;
  bool bVar8;
  undefined1 uVar9;
  undefined1 *local_60;
  undefined1 *local_58;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_50;
  piter local_48;
  piter local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  bVar8 = false;
  if (bVar1) {
    bVar8 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
    ;
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  uVar9 = bVar8;
  QModelIndex::parent((QModelIndex *)in_RDI);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QHash<QPersistentModelIndex,_QEditorInfo>::QHash
            ((QHash<QPersistentModelIndex,_QEditorInfo> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (QHash<QPersistentModelIndex,_QEditorInfo> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_38.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)
               &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (piter)QHash<QPersistentModelIndex,_QEditorInfo>::constBegin
                              ((QHash<QPersistentModelIndex,_QEditorInfo> *)
                               CONCAT17(uVar9,in_stack_ffffffffffffff48));
  while( true ) {
    local_48 = (piter)QHash<QPersistentModelIndex,_QEditorInfo>::constEnd
                                ((QHash<QPersistentModelIndex,_QEditorInfo> *)
                                 CONCAT17(in_stack_ffffffffffffff3f,
                                          CONCAT16(in_stack_ffffffffffffff3e,
                                                   CONCAT15(in_stack_ffffffffffffff3d,
                                                            CONCAT14(in_stack_ffffffffffffff3c,
                                                                     in_stack_ffffffffffffff38)))));
    bVar1 = QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator::operator!=
                      ((const_iterator *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,
                                         CONCAT15(in_stack_ffffffffffffff3d,
                                                  CONCAT14(in_stack_ffffffffffffff3c,
                                                           in_stack_ffffffffffffff38)))),
                       (const_iterator *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (!bVar1) break;
    QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator::value((const_iterator *)0x80a54a);
    pQVar5 = QPointer<QWidget>::data((QPointer<QWidget> *)0x80a552);
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator::key((const_iterator *)0x80a58e);
    QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&local_60);
    pQVar6 = QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator::value
                       ((const_iterator *)0x80a5a8);
    in_stack_ffffffffffffff3f = true;
    if (((pQVar6->isStatic & 1U) == 0) &&
       (in_stack_ffffffffffffff3f = true, pQVar5 != (QWidget *)0x0)) {
      bVar1 = QModelIndex::isValid
                        ((QModelIndex *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      in_stack_ffffffffffffff3f = true;
      if ((bVar1) &&
         (in_stack_ffffffffffffff3e = false, in_stack_ffffffffffffff3f = false, bVar8 != false)) {
        in_stack_ffffffffffffff38 = QModelIndex::row((QModelIndex *)&local_60);
        iVar2 = QModelIndex::row(in_RSI);
        in_stack_ffffffffffffff3d = true;
        in_stack_ffffffffffffff3e = in_stack_ffffffffffffff3d;
        in_stack_ffffffffffffff3f = in_stack_ffffffffffffff3d;
        if (iVar2 <= in_stack_ffffffffffffff38) {
          in_stack_ffffffffffffff34 = QModelIndex::row((QModelIndex *)&local_60);
          iVar2 = QModelIndex::row(in_RDX);
          in_stack_ffffffffffffff3d = true;
          in_stack_ffffffffffffff3e = in_stack_ffffffffffffff3d;
          in_stack_ffffffffffffff3f = in_stack_ffffffffffffff3d;
          if (in_stack_ffffffffffffff34 <= iVar2) {
            in_stack_ffffffffffffff30 = QModelIndex::column((QModelIndex *)&local_60);
            iVar2 = QModelIndex::column(in_RSI);
            in_stack_ffffffffffffff3d = true;
            in_stack_ffffffffffffff3e = in_stack_ffffffffffffff3d;
            in_stack_ffffffffffffff3f = in_stack_ffffffffffffff3d;
            if (iVar2 <= in_stack_ffffffffffffff30) {
              iVar2 = QModelIndex::column((QModelIndex *)&local_60);
              iVar3 = QModelIndex::column(in_RDX);
              in_stack_ffffffffffffff3d = true;
              in_stack_ffffffffffffff3e = in_stack_ffffffffffffff3d;
              in_stack_ffffffffffffff3f = in_stack_ffffffffffffff3d;
              if (iVar2 <= iVar3) {
                QModelIndex::parent((QModelIndex *)in_RDI);
                in_stack_ffffffffffffff3d =
                     ::operator!=((QModelIndex *)
                                  CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                  (QModelIndex *)CONCAT44(iVar2,in_stack_ffffffffffffff28));
                in_stack_ffffffffffffff3e = in_stack_ffffffffffffff3d;
                in_stack_ffffffffffffff3f = in_stack_ffffffffffffff3d;
              }
            }
          }
        }
      }
    }
    if (((bool)in_stack_ffffffffffffff3f == false) &&
       (plVar7 = (long *)(**(code **)(*(long *)&(pQVar4->super_QAbstractScrollArea).super_QFrame.
                                                super_QWidget + 0x208))(pQVar4,&local_60),
       plVar7 != (long *)0x0)) {
      (**(code **)(*plVar7 + 0x80))(plVar7,pQVar5,&local_60);
    }
    QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator::operator++((const_iterator *)in_RDI);
  }
  QHash<QPersistentModelIndex,_QEditorInfo>::~QHash
            ((QHash<QPersistentModelIndex,_QEditorInfo> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::updateEditorData(const QModelIndex &tl, const QModelIndex &br)
{
    Q_Q(QAbstractItemView);
    // we are counting on having relatively few editors
    const bool checkIndexes = tl.isValid() && br.isValid();
    const QModelIndex parent = tl.parent();
    // QTBUG-25370: We need to copy the indexEditorHash, because while we're
    // iterating over it, we are calling methods which can allow user code to
    // call a method on *this which can modify the member indexEditorHash.
    const QIndexEditorHash indexEditorHashCopy = indexEditorHash;
    QIndexEditorHash::const_iterator it = indexEditorHashCopy.constBegin();
    for (; it != indexEditorHashCopy.constEnd(); ++it) {
        QWidget *editor = it.value().widget.data();
        const QModelIndex index = it.key();
        if (it.value().isStatic || !editor || !index.isValid() ||
            (checkIndexes
                && (index.row() < tl.row() || index.row() > br.row()
                    || index.column() < tl.column() || index.column() > br.column()
                    || index.parent() != parent)))
            continue;

        QAbstractItemDelegate *delegate = q->itemDelegateForIndex(index);
        if (delegate) {
            delegate->setEditorData(editor, index);
        }
    }
}